

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_derive_keys(mbedtls_ssl_context *ssl)

{
  mbedtls_cipher_context_t *ctx;
  uchar *puVar1;
  uint uVar2;
  mbedtls_ssl_session *pmVar3;
  mbedtls_ssl_handshake_params *pmVar4;
  mbedtls_ssl_transform *pmVar5;
  _func_int_void_ptr_uchar_ptr_uchar_ptr_size_t_size_t_size_t *p_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uchar *key;
  uchar *key_00;
  byte bVar14;
  int iVar15;
  uint uVar16;
  mbedtls_cipher_info_t *cipher_info;
  mbedtls_md_info_t *md_info;
  code *pcVar17;
  long lVar18;
  ulong uVar19;
  code *pcVar20;
  size_t sVar21;
  mbedtls_cipher_context_t *ctx_00;
  uchar *key_01;
  uchar *puVar22;
  uchar *key_02;
  size_t sVar23;
  size_t __n;
  bool bVar24;
  uchar tmp [64];
  uchar keyblk [256];
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  uchar local_138 [264];
  
  pmVar3 = ssl->session_negotiate;
  pmVar4 = ssl->handshake;
  pmVar5 = ssl->transform_negotiate;
  cipher_info = mbedtls_cipher_info_from_type(pmVar5->ciphersuite_info->cipher);
  if (cipher_info == (mbedtls_cipher_info_t *)0x0) {
    return -0x7100;
  }
  md_info = mbedtls_md_info_from_type(pmVar5->ciphersuite_info->mac);
  if (md_info == (mbedtls_md_info_t *)0x0) {
    return -0x7100;
  }
  if (ssl->minor_ver < 3) {
    pcVar17 = tls1_prf;
    pmVar4->tls_prf = tls1_prf;
    pmVar4->calc_verify = ssl_calc_verify_tls;
    pcVar20 = ssl_calc_finished_tls;
  }
  else {
    if (ssl->minor_ver != 3) {
      return -0x6c00;
    }
    if (pmVar5->ciphersuite_info->mac == MBEDTLS_MD_SHA384) {
      pcVar17 = tls_prf_sha384;
      pmVar4->tls_prf = tls_prf_sha384;
      pmVar4->calc_verify = ssl_calc_verify_tls_sha384;
      pcVar20 = ssl_calc_finished_tls_sha384;
    }
    else {
      pcVar17 = tls_prf_sha256;
      pmVar4->tls_prf = tls_prf_sha256;
      pmVar4->calc_verify = ssl_calc_verify_tls_sha256;
      pcVar20 = ssl_calc_finished_tls_sha256;
    }
  }
  pmVar4->calc_finished = pcVar20;
  if (pmVar4->resume == 0) {
    if (ssl->handshake->extended_ms == 1) {
      (*ssl->handshake->calc_verify)(ssl,local_138);
      sVar23 = 0x24;
      if (ssl->minor_ver == 3) {
        sVar23 = (ulong)(ssl->transform_negotiate->ciphersuite_info->mac == MBEDTLS_MD_SHA384) << 4
                 | 0x20;
      }
      iVar15 = (*pmVar4->tls_prf)(pmVar4->premaster,pmVar4->pmslen,"extended master secret",
                                  local_138,sVar23,pmVar3->master,0x30);
    }
    else {
      iVar15 = (*pcVar17)(pmVar4->premaster,pmVar4->pmslen,"master secret",pmVar4->randbytes,0x40,
                          pmVar3->master,0x30);
    }
    if (iVar15 != 0) {
      return iVar15;
    }
    lVar18 = 0;
    do {
      pmVar4->premaster[lVar18] = '\0';
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x424);
  }
  uVar7 = *(undefined8 *)pmVar4->randbytes;
  uVar8 = *(undefined8 *)(pmVar4->randbytes + 8);
  uVar9 = *(undefined8 *)(pmVar4->randbytes + 0x10);
  uVar10 = *(undefined8 *)(pmVar4->randbytes + 0x18);
  local_158 = *(undefined4 *)(pmVar4->randbytes + 0x20);
  uStack_154 = *(undefined4 *)(pmVar4->randbytes + 0x24);
  uStack_150 = *(undefined4 *)(pmVar4->randbytes + 0x28);
  uStack_14c = *(undefined4 *)(pmVar4->randbytes + 0x2c);
  local_148 = *(undefined4 *)(pmVar4->randbytes + 0x30);
  uStack_144 = *(undefined4 *)(pmVar4->randbytes + 0x34);
  uStack_140 = *(undefined4 *)(pmVar4->randbytes + 0x38);
  uStack_13c = *(undefined4 *)(pmVar4->randbytes + 0x3c);
  uVar11 = *(undefined8 *)(pmVar4->randbytes + 0x28);
  uVar12 = *(undefined8 *)(pmVar4->randbytes + 0x30);
  uVar13 = *(undefined8 *)(pmVar4->randbytes + 0x38);
  *(undefined8 *)pmVar4->randbytes = *(undefined8 *)(pmVar4->randbytes + 0x20);
  *(undefined8 *)(pmVar4->randbytes + 8) = uVar11;
  *(undefined8 *)(pmVar4->randbytes + 0x10) = uVar12;
  *(undefined8 *)(pmVar4->randbytes + 0x18) = uVar13;
  local_178._0_4_ = (undefined4)uVar7;
  local_178._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
  uStack_170._0_4_ = (undefined4)uVar8;
  uStack_170._4_4_ = (undefined4)((ulong)uVar8 >> 0x20);
  local_168._0_4_ = (undefined4)uVar9;
  local_168._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
  uStack_160._0_4_ = (undefined4)uVar10;
  uStack_160._4_4_ = (undefined4)((ulong)uVar10 >> 0x20);
  *(undefined4 *)(pmVar4->randbytes + 0x20) = (undefined4)local_178;
  *(undefined4 *)(pmVar4->randbytes + 0x24) = local_178._4_4_;
  *(undefined4 *)(pmVar4->randbytes + 0x28) = (undefined4)uStack_170;
  *(undefined4 *)(pmVar4->randbytes + 0x2c) = uStack_170._4_4_;
  *(undefined4 *)(pmVar4->randbytes + 0x30) = (undefined4)local_168;
  *(undefined4 *)(pmVar4->randbytes + 0x34) = local_168._4_4_;
  *(undefined4 *)(pmVar4->randbytes + 0x38) = (undefined4)uStack_160;
  *(undefined4 *)(pmVar4->randbytes + 0x3c) = uStack_160._4_4_;
  lVar18 = 0;
  local_178 = uVar7;
  uStack_170 = uVar8;
  local_168 = uVar9;
  uStack_160 = uVar10;
  do {
    *(undefined1 *)((long)&local_178 + lVar18) = 0;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x40);
  iVar15 = (*pmVar4->tls_prf)(pmVar3->master,0x30,"key expansion",pmVar4->randbytes,0x40,local_138,
                              0x100);
  if (iVar15 != 0) {
    return iVar15;
  }
  lVar18 = 0;
  do {
    pmVar4->randbytes[lVar18] = '\0';
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x40);
  pmVar5->keylen = cipher_info->key_bitlen >> 3;
  if ((cipher_info->mode == MBEDTLS_MODE_CCM) || (cipher_info->mode == MBEDTLS_MODE_GCM)) {
    pmVar5->maclen = 0;
    pmVar5->ivlen = 0xc;
    pmVar5->fixed_ivlen = 4;
    pmVar5->minlen = (ulong)((pmVar5->ciphersuite_info->flags & 2) == 0) * 8 + 0x10;
    __n = 0xc;
    sVar23 = 0;
  }
  else {
    iVar15 = mbedtls_md_setup(&pmVar5->md_ctx_enc,md_info,1);
    if (iVar15 != 0) {
      return iVar15;
    }
    iVar15 = mbedtls_md_setup(&pmVar5->md_ctx_dec,md_info,1);
    if (iVar15 != 0) {
      return iVar15;
    }
    bVar14 = mbedtls_md_get_size(md_info);
    sVar23 = (size_t)bVar14;
    uVar19 = 10;
    if (pmVar3->trunc_hmac != 1) {
      uVar19 = sVar23;
    }
    pmVar5->maclen = uVar19;
    __n = (size_t)cipher_info->iv_size;
    pmVar5->ivlen = __n;
    if (cipher_info->mode == MBEDTLS_MODE_STREAM) {
      pmVar5->minlen = uVar19;
    }
    else {
      sVar21 = uVar19 + cipher_info->block_size;
      if (pmVar3->encrypt_then_mac != 1) {
        sVar21 = sVar21 - uVar19 % (ulong)cipher_info->block_size;
      }
      pmVar5->minlen = sVar21;
      if (1 < (uint)ssl->minor_ver) {
        if (1 < ssl->minor_ver - 2U) {
          return -0x6c00;
        }
        pmVar5->minlen = sVar21 + __n;
      }
    }
  }
  uVar16 = *(uint *)&ssl->conf->field_0x174 & 1;
  puVar22 = local_138 + sVar23 * 2;
  uVar2 = pmVar5->keylen;
  puVar1 = puVar22 + uVar2;
  bVar24 = uVar16 == 0;
  key_01 = local_138 + sVar23;
  key = local_138;
  if (bVar24) {
    key_01 = local_138;
    key = local_138 + sVar23;
  }
  key_02 = puVar22;
  key_00 = puVar1;
  if (!bVar24) {
    key_02 = puVar1;
    key_00 = puVar22;
  }
  if (pmVar5->fixed_ivlen != 0) {
    __n = pmVar5->fixed_ivlen;
  }
  memcpy(pmVar5->iv_enc + (uVar16 << 4),puVar1 + uVar2,__n);
  memcpy(pmVar5->iv_enc + (ulong)bVar24 * 0x10,puVar1 + uVar2 + __n,__n);
  if (ssl->minor_ver < 1) {
    return -0x6c00;
  }
  if (sVar23 != 0) {
    mbedtls_md_hmac_starts(&pmVar5->md_ctx_enc,key_01,sVar23);
    mbedtls_md_hmac_starts(&pmVar5->md_ctx_dec,key,sVar23);
  }
  p_Var6 = ssl->conf->f_export_keys;
  if (p_Var6 != (_func_int_void_ptr_uchar_ptr_uchar_ptr_size_t_size_t_size_t *)0x0) {
    (*p_Var6)(ssl->conf->p_export_keys,pmVar3->master,local_138,sVar23,(size_t)pmVar5->keylen,__n);
  }
  ctx = &pmVar5->cipher_ctx_enc;
  iVar15 = mbedtls_cipher_setup(ctx,cipher_info);
  if (iVar15 == 0) {
    ctx_00 = &pmVar5->cipher_ctx_dec;
    iVar15 = mbedtls_cipher_setup(ctx_00,cipher_info);
    if (iVar15 != 0) {
      return iVar15;
    }
    iVar15 = mbedtls_cipher_setkey(ctx,key_02,cipher_info->key_bitlen,MBEDTLS_ENCRYPT);
    if (iVar15 != 0) {
      return iVar15;
    }
    iVar15 = mbedtls_cipher_setkey(ctx_00,key_00,cipher_info->key_bitlen,MBEDTLS_DECRYPT);
    if (iVar15 != 0) {
      return iVar15;
    }
    if (cipher_info->mode == MBEDTLS_MODE_CBC) {
      iVar15 = mbedtls_cipher_set_padding_mode(ctx,MBEDTLS_PADDING_NONE);
      if (iVar15 != 0) {
        return iVar15;
      }
      iVar15 = mbedtls_cipher_set_padding_mode(ctx_00,MBEDTLS_PADDING_NONE);
      if (iVar15 != 0) {
        return iVar15;
      }
    }
    lVar18 = 0;
    do {
      local_138[lVar18] = '\0';
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x100);
    return 0;
  }
  return iVar15;
}

Assistant:

int mbedtls_ssl_derive_keys( mbedtls_ssl_context *ssl )
{
    int ret = 0;
    unsigned char tmp[64];
    unsigned char keyblk[256];
    unsigned char *key1;
    unsigned char *key2;
    unsigned char *mac_enc;
    unsigned char *mac_dec;
    size_t mac_key_len;
    size_t iv_copy_len;
    const mbedtls_cipher_info_t *cipher_info;
    const mbedtls_md_info_t *md_info;

    mbedtls_ssl_session *session = ssl->session_negotiate;
    mbedtls_ssl_transform *transform = ssl->transform_negotiate;
    mbedtls_ssl_handshake_params *handshake = ssl->handshake;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> derive keys" ) );

    cipher_info = mbedtls_cipher_info_from_type( transform->ciphersuite_info->cipher );
    if( cipher_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "cipher info for %d not found",
                            transform->ciphersuite_info->cipher ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    md_info = mbedtls_md_info_from_type( transform->ciphersuite_info->mac );
    if( md_info == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "mbedtls_md info for %d not found",
                            transform->ciphersuite_info->mac ) );
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    /*
     * Set appropriate PRF function and other SSL / TLS / TLS1.2 functions
     */
#if defined(MBEDTLS_SSL_PROTO_SSL3)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        handshake->tls_prf = ssl3_prf;
        handshake->calc_verify = ssl_calc_verify_ssl;
        handshake->calc_finished = ssl_calc_finished_ssl;
    }
    else
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1)
    if( ssl->minor_ver < MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        handshake->tls_prf = tls1_prf;
        handshake->calc_verify = ssl_calc_verify_tls;
        handshake->calc_finished = ssl_calc_finished_tls;
    }
    else
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
#if defined(MBEDTLS_SHA512_C)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 &&
        transform->ciphersuite_info->mac == MBEDTLS_MD_SHA384 )
    {
        handshake->tls_prf = tls_prf_sha384;
        handshake->calc_verify = ssl_calc_verify_tls_sha384;
        handshake->calc_finished = ssl_calc_finished_tls_sha384;
    }
    else
#endif
#if defined(MBEDTLS_SHA256_C)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        handshake->tls_prf = tls_prf_sha256;
        handshake->calc_verify = ssl_calc_verify_tls_sha256;
        handshake->calc_finished = ssl_calc_finished_tls_sha256;
    }
    else
#endif
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    /*
     * SSLv3:
     *   master =
     *     MD5( premaster + SHA1( 'A'   + premaster + randbytes ) ) +
     *     MD5( premaster + SHA1( 'BB'  + premaster + randbytes ) ) +
     *     MD5( premaster + SHA1( 'CCC' + premaster + randbytes ) )
     *
     * TLSv1+:
     *   master = PRF( premaster, "master secret", randbytes )[0..47]
     */
    if( handshake->resume == 0 )
    {
        MBEDTLS_SSL_DEBUG_BUF( 3, "premaster secret", handshake->premaster,
                       handshake->pmslen );

#if defined(MBEDTLS_SSL_EXTENDED_MASTER_SECRET)
        if( ssl->handshake->extended_ms == MBEDTLS_SSL_EXTENDED_MS_ENABLED )
        {
            unsigned char session_hash[48];
            size_t hash_len;

            MBEDTLS_SSL_DEBUG_MSG( 3, ( "using extended master secret" ) );

            ssl->handshake->calc_verify( ssl, session_hash );

#if defined(MBEDTLS_SSL_PROTO_TLS1_2)
            if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
            {
#if defined(MBEDTLS_SHA512_C)
                if( ssl->transform_negotiate->ciphersuite_info->mac ==
                    MBEDTLS_MD_SHA384 )
                {
                    hash_len = 48;
                }
                else
#endif
                    hash_len = 32;
            }
            else
#endif /* MBEDTLS_SSL_PROTO_TLS1_2 */
                hash_len = 36;

            MBEDTLS_SSL_DEBUG_BUF( 3, "session hash", session_hash, hash_len );

            ret = handshake->tls_prf( handshake->premaster, handshake->pmslen,
                                      "extended master secret",
                                      session_hash, hash_len,
                                      session->master, 48 );
            if( ret != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "prf", ret );
                return( ret );
            }

        }
        else
#endif
        ret = handshake->tls_prf( handshake->premaster, handshake->pmslen,
                                  "master secret",
                                  handshake->randbytes, 64,
                                  session->master, 48 );
        if( ret != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "prf", ret );
            return( ret );
        }

        mbedtls_zeroize( handshake->premaster, sizeof(handshake->premaster) );
    }
    else
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "no premaster (session resumed)" ) );

    /*
     * Swap the client and server random values.
     */
    memcpy( tmp, handshake->randbytes, 64 );
    memcpy( handshake->randbytes, tmp + 32, 32 );
    memcpy( handshake->randbytes + 32, tmp, 32 );
    mbedtls_zeroize( tmp, sizeof( tmp ) );

    /*
     *  SSLv3:
     *    key block =
     *      MD5( master + SHA1( 'A'    + master + randbytes ) ) +
     *      MD5( master + SHA1( 'BB'   + master + randbytes ) ) +
     *      MD5( master + SHA1( 'CCC'  + master + randbytes ) ) +
     *      MD5( master + SHA1( 'DDDD' + master + randbytes ) ) +
     *      ...
     *
     *  TLSv1:
     *    key block = PRF( master, "key expansion", randbytes )
     */
    ret = handshake->tls_prf( session->master, 48, "key expansion",
                              handshake->randbytes, 64, keyblk, 256 );
    if( ret != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "prf", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "ciphersuite = %s",
                   mbedtls_ssl_get_ciphersuite_name( session->ciphersuite ) ) );
    MBEDTLS_SSL_DEBUG_BUF( 3, "master secret", session->master, 48 );
    MBEDTLS_SSL_DEBUG_BUF( 4, "random bytes", handshake->randbytes, 64 );
    MBEDTLS_SSL_DEBUG_BUF( 4, "key block", keyblk, 256 );

    mbedtls_zeroize( handshake->randbytes, sizeof( handshake->randbytes ) );

    /*
     * Determine the appropriate key, IV and MAC length.
     */

    transform->keylen = cipher_info->key_bitlen / 8;

    if( cipher_info->mode == MBEDTLS_MODE_GCM ||
        cipher_info->mode == MBEDTLS_MODE_CCM )
    {
        transform->maclen = 0;
        mac_key_len = 0;

        transform->ivlen = 12;
        transform->fixed_ivlen = 4;

        /* Minimum length is expicit IV + tag */
        transform->minlen = transform->ivlen - transform->fixed_ivlen
                            + ( transform->ciphersuite_info->flags &
                                MBEDTLS_CIPHERSUITE_SHORT_TAG ? 8 : 16 );
    }
    else
    {
        /* Initialize HMAC contexts */
        if( ( ret = mbedtls_md_setup( &transform->md_ctx_enc, md_info, 1 ) ) != 0 ||
            ( ret = mbedtls_md_setup( &transform->md_ctx_dec, md_info, 1 ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_md_setup", ret );
            return( ret );
        }

        /* Get MAC length */
        mac_key_len = mbedtls_md_get_size( md_info );
        transform->maclen = mac_key_len;

#if defined(MBEDTLS_SSL_TRUNCATED_HMAC)
        /*
         * If HMAC is to be truncated, we shall keep the leftmost bytes,
         * (rfc 6066 page 13 or rfc 2104 section 4),
         * so we only need to adjust the length here.
         */
        if( session->trunc_hmac == MBEDTLS_SSL_TRUNC_HMAC_ENABLED )
        {
            transform->maclen = MBEDTLS_SSL_TRUNCATED_HMAC_LEN;

#if defined(MBEDTLS_SSL_TRUNCATED_HMAC_COMPAT)
            /* Fall back to old, non-compliant version of the truncated
             * HMAC implementation which also truncates the key
             * (Mbed TLS versions from 1.3 to 2.6.0) */
            mac_key_len = transform->maclen;
#endif
        }
#endif /* MBEDTLS_SSL_TRUNCATED_HMAC */

        /* IV length */
        transform->ivlen = cipher_info->iv_size;

        /* Minimum length */
        if( cipher_info->mode == MBEDTLS_MODE_STREAM )
            transform->minlen = transform->maclen;
        else
        {
            /*
             * GenericBlockCipher:
             * 1. if EtM is in use: one block plus MAC
             *    otherwise: * first multiple of blocklen greater than maclen
             * 2. IV except for SSL3 and TLS 1.0
             */
#if defined(MBEDTLS_SSL_ENCRYPT_THEN_MAC)
            if( session->encrypt_then_mac == MBEDTLS_SSL_ETM_ENABLED )
            {
                transform->minlen = transform->maclen
                                  + cipher_info->block_size;
            }
            else
#endif
            {
                transform->minlen = transform->maclen
                                  + cipher_info->block_size
                                  - transform->maclen % cipher_info->block_size;
            }

#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1)
            if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 ||
                ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_1 )
                ; /* No need to adjust minlen */
            else
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1_1) || defined(MBEDTLS_SSL_PROTO_TLS1_2)
            if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_2 ||
                ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_3 )
            {
                transform->minlen += transform->ivlen;
            }
            else
#endif
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
                return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
            }
        }
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "keylen: %d, minlen: %d, ivlen: %d, maclen: %d",
                   transform->keylen, transform->minlen, transform->ivlen,
                   transform->maclen ) );

    /*
     * Finally setup the cipher contexts, IVs and MAC secrets.
     */
#if defined(MBEDTLS_SSL_CLI_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT )
    {
        key1 = keyblk + mac_key_len * 2;
        key2 = keyblk + mac_key_len * 2 + transform->keylen;

        mac_enc = keyblk;
        mac_dec = keyblk + mac_key_len;

        /*
         * This is not used in TLS v1.1.
         */
        iv_copy_len = ( transform->fixed_ivlen ) ?
                            transform->fixed_ivlen : transform->ivlen;
        memcpy( transform->iv_enc, key2 + transform->keylen,  iv_copy_len );
        memcpy( transform->iv_dec, key2 + transform->keylen + iv_copy_len,
                iv_copy_len );
    }
    else
#endif /* MBEDTLS_SSL_CLI_C */
#if defined(MBEDTLS_SSL_SRV_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER )
    {
        key1 = keyblk + mac_key_len * 2 + transform->keylen;
        key2 = keyblk + mac_key_len * 2;

        mac_enc = keyblk + mac_key_len;
        mac_dec = keyblk;

        /*
         * This is not used in TLS v1.1.
         */
        iv_copy_len = ( transform->fixed_ivlen ) ?
                            transform->fixed_ivlen : transform->ivlen;
        memcpy( transform->iv_dec, key1 + transform->keylen,  iv_copy_len );
        memcpy( transform->iv_enc, key1 + transform->keylen + iv_copy_len,
                iv_copy_len );
    }
    else
#endif /* MBEDTLS_SSL_SRV_C */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

#if defined(MBEDTLS_SSL_PROTO_SSL3)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
    {
        if( mac_key_len > sizeof transform->mac_enc )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        memcpy( transform->mac_enc, mac_enc, mac_key_len );
        memcpy( transform->mac_dec, mac_dec, mac_key_len );
    }
    else
#endif /* MBEDTLS_SSL_PROTO_SSL3 */
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
    defined(MBEDTLS_SSL_PROTO_TLS1_2)
    if( ssl->minor_ver >= MBEDTLS_SSL_MINOR_VERSION_1 )
    {
        /* For HMAC-based ciphersuites, initialize the HMAC transforms.
           For AEAD-based ciphersuites, there is nothing to do here. */
        if( mac_key_len != 0 )
        {
            mbedtls_md_hmac_starts( &transform->md_ctx_enc, mac_enc, mac_key_len );
            mbedtls_md_hmac_starts( &transform->md_ctx_dec, mac_dec, mac_key_len );
        }
    }
    else
#endif
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

#if defined(MBEDTLS_SSL_HW_RECORD_ACCEL)
    if( mbedtls_ssl_hw_record_init != NULL )
    {
        int ret = 0;

        MBEDTLS_SSL_DEBUG_MSG( 2, ( "going for mbedtls_ssl_hw_record_init()" ) );

        if( ( ret = mbedtls_ssl_hw_record_init( ssl, key1, key2, transform->keylen,
                                        transform->iv_enc, transform->iv_dec,
                                        iv_copy_len,
                                        mac_enc, mac_dec,
                                        mac_key_len ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_hw_record_init", ret );
            return( MBEDTLS_ERR_SSL_HW_ACCEL_FAILED );
        }
    }
#endif /* MBEDTLS_SSL_HW_RECORD_ACCEL */

#if defined(MBEDTLS_SSL_EXPORT_KEYS)
    if( ssl->conf->f_export_keys != NULL )
    {
        ssl->conf->f_export_keys( ssl->conf->p_export_keys,
                                  session->master, keyblk,
                                  mac_key_len, transform->keylen,
                                  iv_copy_len );
    }
#endif

    if( ( ret = mbedtls_cipher_setup( &transform->cipher_ctx_enc,
                                 cipher_info ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setup", ret );
        return( ret );
    }

    if( ( ret = mbedtls_cipher_setup( &transform->cipher_ctx_dec,
                                 cipher_info ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setup", ret );
        return( ret );
    }

    if( ( ret = mbedtls_cipher_setkey( &transform->cipher_ctx_enc, key1,
                               cipher_info->key_bitlen,
                               MBEDTLS_ENCRYPT ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setkey", ret );
        return( ret );
    }

    if( ( ret = mbedtls_cipher_setkey( &transform->cipher_ctx_dec, key2,
                               cipher_info->key_bitlen,
                               MBEDTLS_DECRYPT ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_setkey", ret );
        return( ret );
    }

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    if( cipher_info->mode == MBEDTLS_MODE_CBC )
    {
        if( ( ret = mbedtls_cipher_set_padding_mode( &transform->cipher_ctx_enc,
                                             MBEDTLS_PADDING_NONE ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_set_padding_mode", ret );
            return( ret );
        }

        if( ( ret = mbedtls_cipher_set_padding_mode( &transform->cipher_ctx_dec,
                                             MBEDTLS_PADDING_NONE ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_set_padding_mode", ret );
            return( ret );
        }
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    mbedtls_zeroize( keyblk, sizeof( keyblk ) );

#if defined(MBEDTLS_ZLIB_SUPPORT)
    // Initialize compression
    //
    if( session->compression == MBEDTLS_SSL_COMPRESS_DEFLATE )
    {
        if( ssl->compress_buf == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 3, ( "Allocating compression buffer" ) );
            ssl->compress_buf = mbedtls_calloc( 1, MBEDTLS_SSL_BUFFER_LEN );
            if( ssl->compress_buf == NULL )
            {
                MBEDTLS_SSL_DEBUG_MSG( 1, ( "alloc(%d bytes) failed",
                                    MBEDTLS_SSL_BUFFER_LEN ) );
                return( MBEDTLS_ERR_SSL_ALLOC_FAILED );
            }
        }

        MBEDTLS_SSL_DEBUG_MSG( 3, ( "Initializing zlib states" ) );

        memset( &transform->ctx_deflate, 0, sizeof( transform->ctx_deflate ) );
        memset( &transform->ctx_inflate, 0, sizeof( transform->ctx_inflate ) );

        if( deflateInit( &transform->ctx_deflate,
                         Z_DEFAULT_COMPRESSION )   != Z_OK ||
            inflateInit( &transform->ctx_inflate ) != Z_OK )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "Failed to initialize compression" ) );
            return( MBEDTLS_ERR_SSL_COMPRESSION_FAILED );
        }
    }
#endif /* MBEDTLS_ZLIB_SUPPORT */

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= derive keys" ) );

    return( 0 );
}